

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O2

KeyData * __thiscall
cfd::core::ExtPrivkey::DerivePubkeyData
          (KeyData *__return_storage_ptr__,ExtPrivkey *this,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *path)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_b8;
  ByteData fingerprint;
  ExtPubkey key;
  
  DerivePubkey(&key,this,path);
  Privkey::GeneratePubkey((Pubkey *)&_Stack_b8,&this->privkey_,true);
  Pubkey::GetFingerprint(&fingerprint,(Pubkey *)&_Stack_b8,4);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_b8);
  KeyData::KeyData(__return_storage_ptr__,&key,path,&fingerprint);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
  ExtPubkey::~ExtPubkey(&key);
  return __return_storage_ptr__;
}

Assistant:

KeyData ExtPrivkey::DerivePubkeyData(const std::vector<uint32_t>& path) const {
  ExtPubkey key = DerivePubkey(path);
  auto fingerprint = privkey_.GeneratePubkey().GetFingerprint();
  return KeyData(key, path, fingerprint);
}